

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult __thiscall
testing::internal::EqFailure
          (internal *this,char *lhs_expression,char *rhs_expression,string *lhs_value,
          string *rhs_value,bool ignoring_case)

{
  AssertionResult *this_00;
  int iVar1;
  size_t sVar2;
  AssertionResult *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  ostream *poVar4;
  AssertionResult AVar5;
  Message msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rhs_lines;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lhs_lines;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  string local_88;
  AssertionResult *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68 = (AssertionResult *)this;
  Message::Message((Message *)&local_90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_90.ptr_ + 0x10),"Expected equality of these values:",0x22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90.ptr_ + 0x10),"\n  ",3);
  poVar4 = (ostream *)(local_90.ptr_ + 0x10);
  if (lhs_expression == (char *)0x0) {
    sVar2 = 6;
    lhs_expression = "(null)";
  }
  else {
    sVar2 = strlen(lhs_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,lhs_expression,sVar2);
  iVar1 = std::__cxx11::string::compare((char *)lhs_value);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"\n    Which is: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),(lhs_value->_M_dataplus)._M_p,
               lhs_value->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_90.ptr_ + 0x10),"\n  ",3);
  poVar4 = (ostream *)(local_90.ptr_ + 0x10);
  if (rhs_expression == (char *)0x0) {
    sVar2 = 6;
    rhs_expression = "(null)";
  }
  else {
    sVar2 = strlen(rhs_expression);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,rhs_expression,sVar2);
  iVar1 = std::__cxx11::string::compare((char *)rhs_value);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"\n    Which is: ",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),(rhs_value->_M_dataplus)._M_p,
               rhs_value->_M_string_length);
  }
  if (ignoring_case) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_90.ptr_ + 0x10),"\nIgnoring case",0xe);
  }
  this_00 = local_68;
  if ((lhs_value->_M_string_length != 0) && (rhs_value->_M_string_length != 0)) {
    anon_unknown_100::SplitEscapedString(&local_48,lhs_value);
    anon_unknown_100::SplitEscapedString(&local_60,rhs_value);
    if ((0x20 < (ulong)((long)local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)) ||
       (0x20 < (ulong)((long)local_60.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_60.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_90.ptr_ + 0x10),"\nWith diff:\n",0xc);
      edit_distance::CreateUnifiedDiff(&local_88,&local_48,&local_60,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_90.ptr_ + 0x10),
                 (char *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                 local_88._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
          &local_88.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                        local_88.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  local_88._M_dataplus._M_p._0_1_ = 0;
  local_88._M_string_length = 0;
  other = AssertionResult::operator<<((AssertionResult *)&local_88,(Message *)&local_90);
  AssertionResult::AssertionResult(this_00,other);
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_88._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar3.ptr_ = extraout_RDX;
  if (local_90.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_90.ptr_ + 8))();
    sVar3.ptr_ = extraout_RDX_00;
  }
  AVar5.message_.ptr_ = sVar3.ptr_;
  AVar5._0_8_ = this_00;
  return AVar5;
}

Assistant:

AssertionResult EqFailure(const char* lhs_expression,
                          const char* rhs_expression,
                          const std::string& lhs_value,
                          const std::string& rhs_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Expected equality of these values:";
  msg << "\n  " << lhs_expression;
  if (lhs_value != lhs_expression) {
    msg << "\n    Which is: " << lhs_value;
  }
  msg << "\n  " << rhs_expression;
  if (rhs_value != rhs_expression) {
    msg << "\n    Which is: " << rhs_value;
  }

  if (ignoring_case) {
    msg << "\nIgnoring case";
  }

  if (!lhs_value.empty() && !rhs_value.empty()) {
    const std::vector<std::string> lhs_lines =
        SplitEscapedString(lhs_value);
    const std::vector<std::string> rhs_lines =
        SplitEscapedString(rhs_value);
    if (lhs_lines.size() > 1 || rhs_lines.size() > 1) {
      msg << "\nWith diff:\n"
          << edit_distance::CreateUnifiedDiff(lhs_lines, rhs_lines);
    }
  }

  return AssertionFailure() << msg;
}